

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_compressStream2
                 (ZSTD_CCtx *cctx,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective endOp)

{
  ZSTD_cStreamStage ZVar1;
  void *pvVar2;
  void *pvVar3;
  bool bVar4;
  size_t err_code;
  size_t sVar5;
  ulong uVar6;
  void *pvVar7;
  size_t sVar8;
  bool bVar9;
  size_t srcSize;
  void *src;
  void *src_00;
  size_t err_code_1;
  ulong uVar10;
  char *dst;
  ulong uVar11;
  char *dst_00;
  size_t sStack_80;
  
  if (output->size < output->pos) {
    sStack_80 = 0xffffffffffffffba;
  }
  else if (input->size < input->pos) {
    sStack_80 = 0xffffffffffffffb8;
  }
  else if (endOp < (ZSTD_e_end|ZSTD_e_flush)) {
    if (cctx->streamStage == zcss_init) {
      sVar5 = ZSTD_CCtx_init_compressStream2(cctx,endOp,input->size);
      if (0xffffffffffffff88 < sVar5) {
        return sVar5;
      }
      ZSTD_setBufferExpectations(cctx,output,input);
    }
    if (((cctx->appliedParams).inBufferMode != ZSTD_bm_stable) ||
       ((((sStack_80 = 0xffffffffffffff97, (cctx->expectedInBuffer).src == input->src &&
          ((cctx->expectedInBuffer).pos == input->pos)) && (endOp == ZSTD_e_end)) &&
        ((cctx->expectedInBuffer).size == input->size)))) {
      if (((cctx->appliedParams).outBufferMode != ZSTD_bm_stable) ||
         (cctx->expectedOutBufferSize == output->size - output->pos)) {
        pvVar2 = input->src;
        pvVar7 = (void *)(input->size + (long)pvVar2);
        src = (void *)(input->pos + (long)pvVar2);
        pvVar3 = output->dst;
        sVar5 = output->size;
        dst = (char *)(output->pos + (long)pvVar3);
        do {
          bVar4 = false;
LAB_004f98fb:
          if (bVar4) {
            input->pos = (long)src - (long)pvVar2;
            output->pos = (long)dst - (long)pvVar3;
            if (cctx->frameEnded == 0) {
              sVar5 = cctx->inBuffTarget - cctx->inBuffPos;
              if (sVar5 == 0) {
                sVar5 = cctx->blockSize;
              }
              if (0xffffffffffffff88 < sVar5) {
                return sVar5;
              }
            }
            ZSTD_setBufferExpectations(cctx,output,input);
            return cctx->outBuffContentSize - cctx->outBuffFlushedSize;
          }
          ZVar1 = cctx->streamStage;
          if (ZVar1 == zcss_load) {
            if (endOp != ZSTD_e_end) {
LAB_004f998c:
              if ((cctx->appliedParams).inBufferMode == ZSTD_bm_buffered) {
                sVar8 = cctx->inBuffPos;
                uVar6 = cctx->inBuffTarget - sVar8;
                uVar10 = (long)pvVar7 - (long)src;
                if (uVar6 < (ulong)((long)pvVar7 - (long)src)) {
                  uVar10 = uVar6;
                }
                if (uVar10 != 0) {
                  memcpy(cctx->inBuff + sVar8,src,uVar10);
                  sVar8 = cctx->inBuffPos;
                }
                uVar6 = sVar8 + uVar10;
                cctx->inBuffPos = uVar6;
                src = (void *)((long)src + uVar10);
                if (endOp == ZSTD_e_flush) {
                  bVar4 = true;
                  if (uVar6 == cctx->inToCompress) goto LAB_004f98fb;
                }
                else if ((endOp == ZSTD_e_continue) && (bVar4 = true, uVar6 < cctx->inBuffTarget))
                goto LAB_004f98fb;
                sVar8 = (long)pvVar3 + (sVar5 - (long)dst);
                if ((cctx->appliedParams).inBufferMode != ZSTD_bm_buffered) goto LAB_004f99a1;
                uVar6 = uVar6 - cctx->inToCompress;
                bVar4 = true;
                src_00 = src;
              }
              else {
                sVar8 = (long)pvVar3 + (sVar5 - (long)dst);
LAB_004f99a1:
                uVar6 = (long)pvVar7 - (long)src;
                if (cctx->blockSize <= (ulong)((long)pvVar7 - (long)src)) {
                  uVar6 = cctx->blockSize;
                }
                bVar4 = false;
                src_00 = src;
              }
              uVar10 = (ulong)(0x20000U - (int)uVar6 >> 0xb);
              if (0x1ffff < uVar6) {
                uVar10 = 0;
              }
              dst_00 = dst;
              if ((sVar8 < uVar10 + (uVar6 >> 8) + uVar6) &&
                 ((cctx->appliedParams).outBufferMode != ZSTD_bm_stable)) {
                sVar8 = cctx->outBuffSize;
                dst_00 = cctx->outBuff;
              }
              if (bVar4) {
                bVar9 = src_00 == pvVar7 && endOp == ZSTD_e_end;
                if (src_00 == pvVar7 && endOp == ZSTD_e_end) {
                  uVar10 = ZSTD_compressEnd(cctx,dst_00,sVar8,cctx->inBuff + cctx->inToCompress,
                                            uVar6);
                }
                else {
                  uVar10 = ZSTD_compressContinue
                                     (cctx,dst_00,sVar8,cctx->inBuff + cctx->inToCompress,uVar6);
                }
                if (0xffffffffffffff88 < uVar10) {
                  return uVar10;
                }
                cctx->frameEnded = (uint)bVar9;
                sVar8 = cctx->inBuffPos;
                uVar6 = cctx->blockSize + sVar8;
                cctx->inBuffTarget = uVar6;
                if (cctx->inBuffSize < uVar6) {
                  cctx->inBuffPos = 0;
                  cctx->inBuffTarget = cctx->blockSize;
                  sVar8 = 0;
                }
                cctx->inToCompress = sVar8;
                src = src_00;
              }
              else {
                src = (void *)((long)src_00 + uVar6);
                bVar9 = src == pvVar7;
                if (bVar9) {
                  uVar10 = ZSTD_compressEnd(cctx,dst_00,sVar8,src_00,uVar6);
                }
                else {
                  uVar10 = ZSTD_compressContinue(cctx,dst_00,sVar8,src_00,uVar6);
                }
                if (0xffffffffffffff88 < uVar10) {
                  return uVar10;
                }
                cctx->frameEnded = (uint)bVar9;
              }
              if (dst_00 != dst) {
                cctx->outBuffContentSize = uVar10;
                cctx->outBuffFlushedSize = 0;
                cctx->streamStage = zcss_flush;
                sVar8 = 0;
                goto LAB_004f9b96;
              }
              dst = dst + uVar10;
              bVar4 = false;
              if (bVar9) {
                cctx->streamStage = zcss_init;
                cctx->pledgedSrcSizePlusOne = 0;
                bVar4 = true;
              }
              goto LAB_004f98fb;
            }
            sVar8 = (long)pvVar3 + (sVar5 - (long)dst);
            srcSize = (long)pvVar7 - (long)src;
            uVar10 = (ulong)(0x20000U - (int)srcSize >> 0xb);
            if (0x1ffff < srcSize) {
              uVar10 = 0;
            }
            if (((sVar8 < uVar10 + (srcSize >> 8) + srcSize) &&
                ((cctx->appliedParams).outBufferMode != ZSTD_bm_stable)) || (cctx->inBuffPos != 0))
            goto LAB_004f998c;
            sVar8 = ZSTD_compressEnd(cctx,dst,sVar8,src,srcSize);
            if (0xffffffffffffff88 < sVar8) {
              return sVar8;
            }
            cctx->streamStage = zcss_init;
            cctx->frameEnded = 1;
            cctx->pledgedSrcSizePlusOne = 0;
            dst = dst + sVar8;
            bVar4 = true;
            src = pvVar7;
            goto LAB_004f98fb;
          }
          if (ZVar1 != zcss_flush) {
            bVar4 = false;
            if (ZVar1 == zcss_init) {
              return 0xffffffffffffffc2;
            }
            goto LAB_004f98fb;
          }
          uVar10 = cctx->outBuffContentSize;
          sVar8 = cctx->outBuffFlushedSize;
LAB_004f9b96:
          uVar10 = uVar10 - sVar8;
          uVar11 = (long)pvVar3 + (sVar5 - (long)dst);
          uVar6 = uVar10;
          if (uVar11 < uVar10) {
            uVar6 = uVar11;
          }
          if (uVar6 != 0) {
            memcpy(dst,cctx->outBuff + sVar8,uVar6);
            sVar8 = cctx->outBuffFlushedSize;
          }
          dst = dst + uVar6;
          cctx->outBuffFlushedSize = sVar8 + uVar6;
          bVar4 = true;
          if (uVar11 < uVar10) goto LAB_004f98fb;
          cctx->outBuffContentSize = 0;
          cctx->outBuffFlushedSize = 0;
          if (cctx->frameEnded != 0) {
            cctx->streamStage = zcss_init;
            cctx->pledgedSrcSizePlusOne = 0;
            goto LAB_004f98fb;
          }
          cctx->streamStage = zcss_load;
        } while( true );
      }
      sStack_80 = 0xffffffffffffff98;
    }
  }
  else {
    sStack_80 = 0xffffffffffffffd6;
  }
  return sStack_80;
}

Assistant:

size_t ZSTD_compressStream2( ZSTD_CCtx* cctx,
                             ZSTD_outBuffer* output,
                             ZSTD_inBuffer* input,
                             ZSTD_EndDirective endOp)
{
    DEBUGLOG(5, "ZSTD_compressStream2, endOp=%u ", (unsigned)endOp);
    /* check conditions */
    RETURN_ERROR_IF(output->pos > output->size, dstSize_tooSmall, "invalid output buffer");
    RETURN_ERROR_IF(input->pos  > input->size, srcSize_wrong, "invalid input buffer");
    RETURN_ERROR_IF((U32)endOp > (U32)ZSTD_e_end, parameter_outOfBound, "invalid endDirective");
    assert(cctx != NULL);

    /* transparent initialization stage */
    if (cctx->streamStage == zcss_init) {
        FORWARD_IF_ERROR(ZSTD_CCtx_init_compressStream2(cctx, endOp, input->size), "CompressStream2 initialization failed");
        ZSTD_setBufferExpectations(cctx, output, input);    /* Set initial buffer expectations now that we've initialized */
    }
    /* end of transparent initialization stage */

    FORWARD_IF_ERROR(ZSTD_checkBufferStability(cctx, output, input, endOp), "invalid buffers");
    /* compression stage */
#ifdef ZSTD_MULTITHREAD
    if (cctx->appliedParams.nbWorkers > 0) {
        size_t flushMin;
        if (cctx->cParamsChanged) {
            ZSTDMT_updateCParams_whileCompressing(cctx->mtctx, &cctx->requestedParams);
            cctx->cParamsChanged = 0;
        }
        for (;;) {
            size_t const ipos = input->pos;
            size_t const opos = output->pos;
            flushMin = ZSTDMT_compressStream_generic(cctx->mtctx, output, input, endOp);
            cctx->consumedSrcSize += (U64)(input->pos - ipos);
            cctx->producedCSize += (U64)(output->pos - opos);
            if ( ZSTD_isError(flushMin)
              || (endOp == ZSTD_e_end && flushMin == 0) ) { /* compression completed */
                if (flushMin == 0)
                    ZSTD_CCtx_trace(cctx, 0);
                ZSTD_CCtx_reset(cctx, ZSTD_reset_session_only);
            }
            FORWARD_IF_ERROR(flushMin, "ZSTDMT_compressStream_generic failed");

            if (endOp == ZSTD_e_continue) {
                /* We only require some progress with ZSTD_e_continue, not maximal progress.
                 * We're done if we've consumed or produced any bytes, or either buffer is
                 * full.
                 */
                if (input->pos != ipos || output->pos != opos || input->pos == input->size || output->pos == output->size)
                    break;
            } else {
                assert(endOp == ZSTD_e_flush || endOp == ZSTD_e_end);
                /* We require maximal progress. We're done when the flush is complete or the
                 * output buffer is full.
                 */
                if (flushMin == 0 || output->pos == output->size)
                    break;
            }
        }
        DEBUGLOG(5, "completed ZSTD_compressStream2 delegating to ZSTDMT_compressStream_generic");
        /* Either we don't require maximum forward progress, we've finished the
         * flush, or we are out of output space.
         */
        assert(endOp == ZSTD_e_continue || flushMin == 0 || output->pos == output->size);
        ZSTD_setBufferExpectations(cctx, output, input);
        return flushMin;
    }
#endif
    FORWARD_IF_ERROR( ZSTD_compressStream_generic(cctx, output, input, endOp) , "");
    DEBUGLOG(5, "completed ZSTD_compressStream2");
    ZSTD_setBufferExpectations(cctx, output, input);
    return cctx->outBuffContentSize - cctx->outBuffFlushedSize; /* remaining to flush */
}